

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O3

void __thiscall Centaurus::NFA<wchar_t>::concat(NFA<wchar_t> *this,NFA<wchar_t> *nfa)

{
  pointer pNVar1;
  int value;
  pointer src;
  pointer this_00;
  vector<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
  *this_01;
  NFABaseState<wchar_t,_int> local_58;
  
  pNVar1 = (this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
           super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  src = (nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
        super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  this_00 = src + 1;
  value = (int)((ulong)((long)(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states
                              .
                              super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) >> 3) *
          -0x33333333 + -1;
  if (this_00 !=
      (nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
      super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_01 = &(this->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states;
    do {
      NFABaseState<wchar_t,_int>::offset(&local_58,this_00,value);
      std::
      vector<Centaurus::NFABaseState<wchar_t,int>,std::allocator<Centaurus::NFABaseState<wchar_t,int>>>
      ::emplace_back<Centaurus::NFABaseState<wchar_t,int>>
                ((vector<Centaurus::NFABaseState<wchar_t,int>,std::allocator<Centaurus::NFABaseState<wchar_t,int>>>
                  *)this_01,&local_58);
      local_58._vptr_NFABaseState = (_func_int **)&PTR__NFABaseState_0019c260;
      std::
      vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ::~vector(&local_58.m_transitions);
      this_00 = this_00 + 1;
    } while (this_00 !=
             (nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
             super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    pNVar1 = (this_01->
             super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    src = (nfa->super_NFABase<Centaurus::NFABaseState<wchar_t,_int>_>).m_states.
          super__Vector_base<Centaurus::NFABaseState<wchar_t,_int>,_std::allocator<Centaurus::NFABaseState<wchar_t,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  }
  NFABaseState<wchar_t,_int>::rebase_transitions(pNVar1 + value,src,value);
  return;
}

Assistant:

void concat(const NFA<TCHAR>& nfa)
    {
        int initial_size = m_states.size();

        auto i = nfa.m_states.cbegin() + 1;

        for (; i != nfa.m_states.cend(); i++)
        {
            m_states.push_back(i->offset(initial_size - 1));
        }

        m_states[initial_size - 1].rebase_transitions(nfa.m_states[0], initial_size - 1);
    }